

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBlock::VerifyPageHeapPattern(LargeHeapBlock *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  bVar3 = IsAll((byte *)this->pageHeapData->objectPageAddr,(ulong)this->pageHeapData->paddingBytes,
                0xf0);
  if (bVar3) {
    bVar3 = IsAll((byte *)this->pageHeapData->objectEndAddr,(ulong)this->pageHeapData->unusedBytes,
                  0xf0);
    if (bVar3) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x14f,"(false)","false");
    if (bVar3) {
      *puVar1 = 0;
      ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,2);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x149,"(false)","false");
    if (bVar3) {
      *puVar1 = 0;
      ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,2);
    }
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

_NOINLINE
void LargeHeapBlock::VerifyPageHeapPattern()
{
    if (!IsAll((byte*)pageHeapData->objectPageAddr, pageHeapData->paddingBytes, PageHeapMemFill))
    {
        Assert(false);
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 2);
    }

    if (!IsAll((byte*)pageHeapData->objectEndAddr, pageHeapData->unusedBytes, PageHeapMemFill))
    {
        Assert(false);
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 2);
    }
}